

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

void addMomentum(NeuralNetwork *nn,OptimizerTypeCase optimizerType,double defaultValue,
                double minValue,double maxValue)

{
  NetworkUpdateParameters *pNVar1;
  Optimizer *pOVar2;
  SGDOptimizer *pSVar3;
  DoubleParameter *pDVar4;
  DoubleRange *pDVar5;
  
  if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
    pNVar1 = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(pNVar1);
    nn->updateparams_ = pNVar1;
  }
  pNVar1 = nn->updateparams_;
  if (pNVar1->optimizer_ == (Optimizer *)0x0) {
    pOVar2 = (Optimizer *)operator_new(0x20);
    CoreML::Specification::Optimizer::Optimizer(pOVar2);
    pNVar1->optimizer_ = pOVar2;
  }
  pOVar2 = pNVar1->optimizer_;
  if (pOVar2->_oneof_case_[0] != 10) {
    CoreML::Specification::Optimizer::clear_OptimizerType(pOVar2);
    pOVar2->_oneof_case_[0] = 10;
    pSVar3 = (SGDOptimizer *)operator_new(0x30);
    CoreML::Specification::SGDOptimizer::SGDOptimizer(pSVar3);
    (pOVar2->OptimizerType_).sgdoptimizer_ = pSVar3;
  }
  pSVar3 = (pOVar2->OptimizerType_).sgdoptimizer_;
  if (pSVar3->momentum_ == (DoubleParameter *)0x0) {
    pDVar4 = (DoubleParameter *)operator_new(0x28);
    CoreML::Specification::DoubleParameter::DoubleParameter(pDVar4);
    pSVar3->momentum_ = pDVar4;
  }
  pDVar4 = pSVar3->momentum_;
  pDVar4->defaultvalue_ = defaultValue;
  if (pDVar4->_oneof_case_[0] != 10) {
    CoreML::Specification::DoubleParameter::clear_AllowedValues(pDVar4);
    pDVar4->_oneof_case_[0] = 10;
    pDVar5 = (DoubleRange *)operator_new(0x28);
    CoreML::Specification::DoubleRange::DoubleRange(pDVar5);
    (pDVar4->AllowedValues_).range_ = pDVar5;
  }
  pDVar5 = (pDVar4->AllowedValues_).range_;
  pDVar5->minvalue_ = minValue;
  pDVar5->maxvalue_ = maxValue;
  return;
}

Assistant:

void addMomentum(Specification::NeuralNetwork *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue, double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    auto realOptimizer = (::CoreML::Specification::SGDOptimizer*)NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            realOptimizer = optimizer->mutable_sgdoptimizer();
            break;
        default:
            break;
    }
    
    auto momentum = realOptimizer->mutable_momentum();
    
    momentum->set_defaultvalue(defaultValue);
    
    auto doubleRange = momentum->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}